

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O0

void __thiscall riffcpp::Chunk::Chunk(Chunk *this,char *filename)

{
  streampos *psVar1;
  byte bVar2;
  uint32_t uVar3;
  impl *this_00;
  Error *pEVar4;
  element_type *peVar5;
  streamoff sVar6;
  streamoff sVar7;
  fpos<__mbstate_t> local_b8;
  streamoff local_a8;
  __mbstate_t _Stack_a0;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_98;
  streamoff local_88;
  __mbstate_t _Stack_80;
  shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> local_70;
  _Type local_5c;
  streampos local_58;
  streampos local_48;
  undefined1 local_38 [8];
  shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> stream;
  char *local_18;
  char *filename_local;
  Chunk *this_local;
  
  local_18 = filename;
  filename_local = (char *)this;
  this_00 = (impl *)operator_new(0x48);
  (this_00->m_limit)._M_off = 0;
  (this_00->m_limit)._M_state.__count = 0;
  (this_00->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_pos)._M_off = 0;
  (this_00->m_pos)._M_state.__count = 0;
  (this_00->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this_00->m_buf).
  super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->m_stream).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00->m_id = (_Type)0x0;
  this_00->m_size = 0;
  impl::impl(this_00);
  this->pimpl = this_00;
  std::make_shared<std::ifstream,char_const*&,std::_Ios_Openmode_const&>
            ((char **)local_38,(_Ios_Openmode *)&local_18);
  std::
  __shared_ptr_access<std::basic_ifstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_ifstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_38);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    pEVar4 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar4,"Couldn\'t open specified file",CannotOpenFile);
    __cxa_throw(pEVar4,&Error::typeinfo,0);
  }
  std::shared_ptr<std::istream>::operator=
            ((shared_ptr<std::istream> *)this->pimpl,
             (shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_38);
  std::
  __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this->pimpl);
  local_48 = (streampos)std::istream::tellg();
  this->pimpl->m_pos = local_48;
  peVar5 = std::
           __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->pimpl);
  std::istream::seekg((long)peVar5,_S_beg);
  std::
  __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this->pimpl);
  local_58 = (streampos)std::istream::tellg();
  this->pimpl->m_limit = local_58;
  std::shared_ptr<std::istream>::shared_ptr<std::ifstream,void>
            ((shared_ptr<std::istream> *)&local_70,
             (shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_38);
  psVar1 = &this->pimpl->m_pos;
  local_88 = psVar1->_M_off;
  _Stack_80 = (this->pimpl->m_pos)._M_state;
  local_5c = (_Type)read_id(&local_70,*psVar1);
  *&(this->pimpl->m_id)._M_elems = local_5c;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_70);
  std::shared_ptr<std::istream>::shared_ptr<std::ifstream,void>
            ((shared_ptr<std::istream> *)&local_98,
             (shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_38);
  psVar1 = &this->pimpl->m_pos;
  local_a8 = psVar1->_M_off;
  _Stack_a0 = (this->pimpl->m_pos)._M_state;
  uVar3 = read_size(&local_98,*psVar1);
  this->pimpl->m_size = uVar3;
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::~shared_ptr(&local_98);
  local_b8 = std::fpos<__mbstate_t>::operator+(&this->pimpl->m_pos,(ulong)this->pimpl->m_size);
  sVar6 = std::fpos::operator_cast_to_long((fpos *)&local_b8);
  sVar7 = std::fpos::operator_cast_to_long((fpos *)&this->pimpl->m_limit);
  if (sVar7 < sVar6) {
    pEVar4 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar4,"Chunk size outside of range",InvalidFile);
    __cxa_throw(pEVar4,&Error::typeinfo,0);
  }
  std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_38);
  return;
}

Assistant:

riffcpp::Chunk::Chunk(const char *filename) {
  pimpl = new riffcpp::Chunk::impl();
  auto stream = std::make_shared<std::ifstream>(filename, std::ios::binary);

  if (!stream->is_open()) {
    throw Error("Couldn't open specified file", ErrorType::CannotOpenFile);
  }

  pimpl->m_stream = stream;
  pimpl->m_pos = pimpl->m_stream->tellg();

  pimpl->m_stream->seekg(0, std::ios::end);
  pimpl->m_limit = pimpl->m_stream->tellg();

  pimpl->m_id = read_id(stream, pimpl->m_pos);
  pimpl->m_size = read_size(stream, pimpl->m_pos);

  if (pimpl->m_pos + std::streamoff{pimpl->m_size} > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
}